

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  string *__return_storage_ptr___00;
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  ID id;
  int iVar4;
  SPIRType *type_00;
  CompilerError *pCVar5;
  char *pcVar6;
  uint32_t __val;
  SPIRType *pSVar7;
  char (*ts_7) [2];
  uint local_298;
  BuiltIn builtin;
  string td_line;
  string array_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string *local_1f0;
  string *local_1e8;
  string pack_pfx;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  __buckets_ptr local_68;
  size_type local_60;
  undefined1 local_58 [16];
  float local_48;
  undefined1 local_40 [16];
  
  local_1f0 = qualifier;
  local_1e8 = __return_storage_ptr__;
  bVar2 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  if (bVar2) {
    member_type_id =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,index,
                    SPIRVCrossDecorationPhysicalTypeID);
  }
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,member_type_id);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar2 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationInterfaceOrigID);
  id.id = 0;
  if (bVar2) {
    id.id = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar2 = Compiler::is_matrix((Compiler *)this,type_00);
  if (bVar2) {
    bVar2 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                       DecorationRowMajor);
  }
  else {
    bVar2 = false;
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._0_8_ = &PTR__SPIRType_003a6498;
  local_180._8_8_ = 0;
  local_180._16_4_ = 0;
  local_180._20_4_ = 1;
  local_180._24_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_88.id = 0;
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  local_68 = (__buckets_ptr)(local_40 + 8);
  local_60 = 1;
  local_58 = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  bVar3 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset)
  ;
  if (!bVar3) {
    bVar3 = Compiler::has_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationResourceIndexPrimary);
    if (!bVar3) goto LAB_002a5c13;
  }
  this->is_using_builtin_array = true;
LAB_002a5c13:
  bVar3 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar7 = type_00;
  if (bVar3) {
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&array_type,"Cannot emit a packed struct currently.",
                 (allocator *)&td_line);
      CompilerError::CompilerError(pCVar5,&array_type);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar3 = Compiler::is_matrix((Compiler *)this,type_00);
    if (bVar3) {
      __val = type_00->vecsize;
      local_298 = type_00->columns;
      ::std::__cxx11::string::assign((char *)&pack_pfx);
      if (bVar2 != false) {
        local_298 = type_00->vecsize;
        __val = type_00->columns;
        ::std::__cxx11::string::assign((char *)&pack_pfx);
      }
      pcVar6 = "float";
      if (type_00->width == 0x10) {
        pcVar6 = "half";
      }
      ::std::__cxx11::string::string((string *)&array_type,pcVar6,(allocator *)&td_line);
      ::std::__cxx11::string::string((string *)&td_line,"typedef ",(allocator *)&builtin);
      ::std::operator+(&local_230,"packed_",&array_type);
      ::std::__cxx11::to_string(&local_210,__val);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin
                       ,&local_230,&local_210);
      ::std::__cxx11::string::append((string *)&td_line);
      ::std::__cxx11::string::~string((string *)&builtin);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin
                       ," ",&pack_pfx);
      ::std::__cxx11::string::append((string *)&td_line);
      ::std::__cxx11::string::~string((string *)&builtin);
      ::std::__cxx11::to_string(&local_1a0,type_00->columns);
      ::std::operator+(&local_210,&array_type,&local_1a0);
      ::std::operator+(&local_230,&local_210,"x");
      ::std::__cxx11::to_string(&local_1c0,type_00->vecsize);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin
                       ,&local_230,&local_1c0);
      ::std::__cxx11::string::append((string *)&td_line);
      ::std::__cxx11::string::~string((string *)&builtin);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      ::std::__cxx11::to_string(&local_210,local_298);
      ::std::operator+(&local_230,"[",&local_210);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin
                       ,&local_230,"]");
      ::std::__cxx11::string::append((string *)&td_line);
      ::std::__cxx11::string::~string((string *)&builtin);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::append((char *)&td_line);
      add_typedef_line(this,&td_line);
      ::std::__cxx11::string::~string((string *)&td_line);
      ::std::__cxx11::string::~string((string *)&array_type);
    }
    else {
      bVar2 = Compiler::is_scalar((Compiler *)this,type_00);
      if (!bVar2) {
        ::std::__cxx11::string::assign((char *)&pack_pfx);
      }
    }
  }
  else if (bVar2 != false) {
    pSVar7 = (SPIRType *)local_180;
    SPIRType::operator=(pSVar7,type_00);
    uVar1 = local_180._20_4_;
    local_180._20_4_ = local_180._24_4_;
    local_180._24_4_ = uVar1;
  }
  iVar4 = *(int *)&(type_00->super_IVariant).field_0xc;
  if ((((this->msl_options).platform == iOS) && (iVar4 == 0x10)) && ((type_00->image).sampled == 2))
  {
    bVar2 = Compiler::has_decoration((Compiler *)this,id,DecorationNonWritable);
    if (!bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&array_type,"Writable images are not allowed in argument buffers on iOS."
                 ,(allocator *)&td_line);
      CompilerError::CompilerError(pCVar5,&array_type);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar4 = *(int *)&(type_00->super_IVariant).field_0xc;
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  if (2 < iVar4 - 0x10U) {
    builtin = BuiltInMax;
    bVar2 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
    if (bVar2) {
      this->is_using_builtin_array = true;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&td_line,this,type_00);
    ::std::__cxx11::string::operator=((string *)&array_type,(string *)&td_line);
    ::std::__cxx11::string::~string((string *)&td_line);
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&td_line,this,pSVar7,(ulong)id.id);
  CompilerGLSL::to_member_name_abi_cxx11_((string *)&builtin,&this->super_CompilerGLSL,type,index);
  __return_storage_ptr___00 = local_1e8;
  ts_7 = (char (*) [2])0x2a6005;
  member_attribute_qualifier_abi_cxx11_(&local_230,this,type,index);
  join<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr___00,(spirv_cross *)&pack_pfx,&td_line,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b65a,
             (char (*) [2])local_1f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin,
             &local_230,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x304bae,ts_7);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::__cxx11::string::~string((string *)&builtin);
  ::std::__cxx11::string::~string((string *)&td_line);
  this->is_using_builtin_array = false;
  ::std::__cxx11::string::~string((string *)&array_type);
  SPIRType::~SPIRType((SPIRType *)local_180);
  ::std::__cxx11::string::~string((string *)&pack_pfx);
  return __return_storage_ptr___00;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type;
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (row_major)
	{
		// Need to declare type with flipped vecsize/columns.
		row_major_physical_type = physical_type;
		swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
		declared_type = &row_major_physical_type;
	}

	// Very specifically, image load-store in argument buffers are disallowed on MSL on iOS.
	if (msl_options.is_ios() && physical_type.basetype == SPIRType::Image && physical_type.image.sampled == 2)
	{
		if (!has_decoration(orig_id, DecorationNonWritable))
			SPIRV_CROSS_THROW("Writable images are not allowed in argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;
		if (is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type);
	}

	auto result = join(pack_pfx, type_to_glsl(*declared_type, orig_id), " ", qualifier, to_member_name(type, index),
	                   member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}